

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

LogEst whereSortingCost(WhereInfo *pWInfo,LogEst nRow,int nOrderBy,int nSorted)

{
  LogEst LVar1;
  LogEst LVar2;
  LogEst rSortCost;
  LogEst rScale;
  int nSorted_local;
  int nOrderBy_local;
  LogEst nRow_local;
  WhereInfo *pWInfo_local;
  
  LVar1 = sqlite3LogEst((long)(((nOrderBy - nSorted) * 100) / nOrderBy));
  nSorted_local._2_2_ = nRow;
  if (((pWInfo->wctrlFlags & 0x4000) != 0) && (pWInfo->iLimit < nRow)) {
    nSorted_local._2_2_ = pWInfo->iLimit;
  }
  LVar2 = estLog(nSorted_local._2_2_);
  return nRow + LVar1 + -0x32 + LVar2;
}

Assistant:

static LogEst whereSortingCost(
  WhereInfo *pWInfo,
  LogEst nRow,
  int nOrderBy,
  int nSorted
){
  /* TUNING: Estimated cost of a full external sort, where N is 
  ** the number of rows to sort is:
  **
  **   cost = (3.0 * N * log(N)).
  ** 
  ** Or, if the order-by clause has X terms but only the last Y 
  ** terms are out of order, then block-sorting will reduce the 
  ** sorting cost to:
  **
  **   cost = (3.0 * N * log(N)) * (Y/X)
  **
  ** The (Y/X) term is implemented using stack variable rScale
  ** below.  */
  LogEst rScale, rSortCost;
  assert( nOrderBy>0 && 66==sqlite3LogEst(100) );
  rScale = sqlite3LogEst((nOrderBy-nSorted)*100/nOrderBy) - 66;
  rSortCost = nRow + rScale + 16;

  /* Multiple by log(M) where M is the number of output rows.
  ** Use the LIMIT for M if it is smaller */
  if( (pWInfo->wctrlFlags & WHERE_USE_LIMIT)!=0 && pWInfo->iLimit<nRow ){
    nRow = pWInfo->iLimit;
  }
  rSortCost += estLog(nRow);
  return rSortCost;
}